

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Set_restricted(int g_a,int *list,int size)

{
  Integer *list_00;
  ulong uVar1;
  ulong uVar2;
  
  list_00 = (Integer *)malloc((long)size * 8);
  uVar1 = 0;
  uVar2 = 0;
  if (0 < size) {
    uVar2 = (ulong)(uint)size;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    list_00[uVar1] = (long)list[uVar1];
  }
  pnga_set_restricted((long)g_a,list_00,(long)size);
  free(list_00);
  return;
}

Assistant:

void NGA_Set_restricted(int g_a, int list[], int size)
{
    Integer aa;
    Integer asize = (Integer)size;
    int i;
    Integer *_ga_map_capi;
    aa = (Integer)g_a;
    _ga_map_capi = (Integer*)malloc(size * sizeof(Integer));
    for (i=0; i<size; i++)
       _ga_map_capi[i] = (Integer)list[i];
    wnga_set_restricted(aa,_ga_map_capi,asize);
    free(_ga_map_capi);
}